

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

parser_error parse_monster_spell_freq(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  parser_error pVar3;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint(p,"freq");
    pVar3 = PARSE_ERROR_INVALID_SPELL_FREQ;
    if (0xffffff9b < (uint)(wVar1 + L'\xffffff9b')) {
      pVar3 = PARSE_ERROR_NONE;
      *(int *)((long)pvVar2 + 0x54) = (int)(100 / (ulong)(uint)wVar1);
    }
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_monster_spell_freq(struct parser *p) {
	struct monster_race *r = parser_priv(p);
	int pct;

	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	pct = parser_getint(p, "freq");
	if (pct < 1 || pct > 100)
		return PARSE_ERROR_INVALID_SPELL_FREQ;
	r->freq_spell = 100 / pct;
	return PARSE_ERROR_NONE;
}